

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  bool bVar1;
  undefined8 in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string local_80 [16];
  ReusableStringStream *in_stack_ffffffffffffff90;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_10 [2];
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff60,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff58);
  if (bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (local_10);
    stringify<int>((int *)in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_10);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      in_stack_ffffffffffffff60 =
           ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (local_10);
      stringify<int>((int *)in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_80);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_10);
    }
  }
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }